

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O3

Object<cmCMakePresetsGraphInternal::InListCondition> * __thiscall
cmJSONHelperBuilder::Object<cmCMakePresetsGraphInternal::InListCondition>::
Bind<cmCMakePresetsGraphInternal::InListCondition,std::__cxx11::string,std::function<bool(std::__cxx11::string&,Json::Value_const*,cmJSONState*)>>
          (Object<cmCMakePresetsGraphInternal::InListCondition> *this,string_view *name,
          offset_in_InListCondition_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          member,function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                 *func,bool required)

{
  Object<cmCMakePresetsGraphInternal::InListCondition> *pOVar1;
  _Any_data local_70;
  _Manager_type local_60;
  _Any_data local_50;
  _Manager_type local_40;
  offset_in_InListCondition_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  local_30;
  
  std::
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
  ::function((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              *)&local_50,func);
  local_30 = member;
  std::function<bool(cmCMakePresetsGraphInternal::InListCondition&,Json::Value_const*,cmJSONState*)>
  ::
  function<cmJSONHelperBuilder::Object<cmCMakePresetsGraphInternal::InListCondition>::Bind<cmCMakePresetsGraphInternal::InListCondition,std::__cxx11::string,std::function<bool(std::__cxx11::string&,Json::Value_const*,cmJSONState*)>>(std::basic_string_view<char,std::char_traits<char>>const&,std::__cxx11::string_cmCMakePresetsGraphInternal::InListCondition::*,std::function<bool(std::__cxx11::string&,Json::Value_const*,cmJSONState*)>,bool)::_lambda(cmCMakePresetsGraphInternal::InListCondition&,Json::Value_const*,cmJSONState*)_1_,void>
            ((function<bool(cmCMakePresetsGraphInternal::InListCondition&,Json::Value_const*,cmJSONState*)>
              *)local_70._M_pod_data,(anon_class_40_2_315d8239 *)&local_50);
  pOVar1 = BindPrivate(this,name,(MemberFunction *)&local_70,required);
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, M U::*member, F func,
                 bool required = true)
    {
      return this->BindPrivate(
        name,
        [func, member](T& out, const Json::Value* value, cmJSONState* state)
          -> bool { return func(out.*member, value, state); },
        required);
    }